

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

uchar * nsvg__alloc(NSVGrasterizer *r,int size)

{
  NSVGmemPage *pNVar1;
  uchar *buf;
  int size_local;
  NSVGrasterizer *r_local;
  
  if (size < 0x401) {
    if ((r->curpage == (NSVGmemPage *)0x0) || (0x400 < r->curpage->size + size)) {
      pNVar1 = nsvg__nextPage(r,r->curpage);
      r->curpage = pNVar1;
    }
    r_local = (NSVGrasterizer *)(r->curpage->mem + r->curpage->size);
    r->curpage->size = size + r->curpage->size;
  }
  else {
    r_local = (NSVGrasterizer *)0x0;
  }
  return (uchar *)r_local;
}

Assistant:

static unsigned char* nsvg__alloc(NSVGrasterizer* r, int size)
{
	unsigned char* buf;
	if (size > NSVG__MEMPAGE_SIZE) return NULL;
	if (r->curpage == NULL || r->curpage->size+size > NSVG__MEMPAGE_SIZE) {
		r->curpage = nsvg__nextPage(r, r->curpage);
	}
	buf = &r->curpage->mem[r->curpage->size];
	r->curpage->size += size;
	return buf;
}